

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hamt_map.hpp
# Opt level: O0

pair<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::index::details::empty_class,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::iterator_base<false>,_bool>
* __thiscall
pstore::index::
hamt_map<std::__cxx11::string,pstore::index::details::empty_class,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>>
::insert_or_upsert<std::pair<std::__cxx11::string,pstore::index::details::empty_class>>
          (pair<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::index::details::empty_class,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::iterator_base<false>,_bool>
           *__return_storage_ptr__,
          hamt_map<std::__cxx11::string,pstore::index::details::empty_class,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>>
          *this,transaction_base *transaction,
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::index::details::empty_class>
          *value,bool is_upsert)

{
  uint uVar1;
  bool bVar2;
  uint uVar3;
  size_t hash_00;
  reference value_00;
  pair<pstore::index::details::index_pointer,_bool> pVar4;
  bool local_441;
  iterator_base<false> local_440;
  index_pointer local_350 [2];
  index_pointer local_340;
  undefined1 local_338;
  not_null<pstore::array_stack<pstore::index::details::parent_type,_13UL>_*> local_330;
  index_pointer local_328;
  index_pointer local_320;
  undefined1 local_318;
  size_t local_310;
  hash_type hash;
  undefined1 local_300 [7];
  bool key_exists;
  parent_stack reverse_parents;
  bool local_211;
  iterator_base<false> local_210;
  not_null<pstore::array_stack<pstore::index::details::parent_type,_13UL>_*> local_120;
  address local_118;
  undefined1 local_110 [8];
  parent_stack parents;
  database *db;
  bool is_upsert_local;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::index::details::empty_class>
  *value_local;
  transaction_base *transaction_local;
  hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::index::details::empty_class,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_local;
  
  parents.elements_ = (size_t)transaction_base::db(transaction);
  uVar1 = *(uint *)(this + 0x10);
  uVar3 = database::get_current_revision((database *)parents.elements_);
  if (uVar1 != uVar3) {
    raise<pstore::error_code>(index_not_latest_revision);
  }
  array_stack<pstore::index::details::parent_type,_13UL>::array_stack
            ((array_stack<pstore::index::details::parent_type,_13UL> *)local_110);
  bVar2 = hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::index::details::empty_class,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::index::details::empty_class,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)this);
  if (bVar2) {
    gsl::not_null<pstore::array_stack<pstore::index::details::parent_type,_13UL>_*>::not_null
              (&local_120,(array_stack<pstore::index::details::parent_type,_13UL> *)local_110);
    local_118 = store_leaf_node<std::pair<std::__cxx11::string,pstore::index::details::empty_class>>
                          (this,transaction,value,local_120);
    details::index_pointer::operator=((index_pointer *)(this + 0x18),&local_118);
    *(undefined8 *)(this + 0x20) = 1;
    hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::index::details::empty_class,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::iterator_base<false>::iterator_base
              (&local_210,(database_reference)parents.elements_,
               (array_stack<pstore::index::details::parent_type,_13UL> *)local_110,
               (hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::index::details::empty_class,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this);
    local_211 = true;
    std::
    make_pair<pstore::index::hamt_map<std::__cxx11::string,pstore::index::details::empty_class,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>>::iterator_base<false>,bool>
              (__return_storage_ptr__,&local_210,&local_211);
    hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::index::details::empty_class,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::iterator_base<false>::~iterator_base(&local_210);
  }
  else {
    array_stack<pstore::index::details::parent_type,_13UL>::array_stack
              ((array_stack<pstore::index::details::parent_type,_13UL> *)local_300);
    hash._7_1_ = 0;
    hash_00 = std::
              hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)(this + 0x28),&value->first);
    local_328 = *(index_pointer *)(this + 0x18);
    local_310 = hash_00;
    gsl::not_null<pstore::array_stack<pstore::index::details::parent_type,_13UL>_*>::not_null
              (&local_330,(array_stack<pstore::index::details::parent_type,_13UL> *)local_300);
    pVar4 = insert_node<std::pair<std::__cxx11::string,pstore::index::details::empty_class>>
                      (this,transaction,local_328,value,hash_00,0,local_330,is_upsert);
    local_340 = pVar4.first;
    local_338 = pVar4.second;
    local_320 = local_340;
    local_318 = local_338;
    std::tie<pstore::index::details::index_pointer,bool>(local_350,(bool *)(this + 0x18));
    std::tuple<pstore::index::details::index_pointer&,bool&>::operator=
              ((tuple<pstore::index::details::index_pointer&,bool&> *)&local_350[0].addr_,
               (pair<pstore::index::details::index_pointer,_bool> *)&local_320.addr_);
    while( true ) {
      bVar2 = array_stack<pstore::index::details::parent_type,_13UL>::empty
                        ((array_stack<pstore::index::details::parent_type,_13UL> *)local_300);
      if (((bVar2 ^ 0xffU) & 1) == 0) break;
      value_00 = array_stack<pstore::index::details::parent_type,_13UL>::top
                           ((array_stack<pstore::index::details::parent_type,_13UL> *)local_300);
      array_stack<pstore::index::details::parent_type,_13UL>::push
                ((array_stack<pstore::index::details::parent_type,_13UL> *)local_110,value_00);
      array_stack<pstore::index::details::parent_type,_13UL>::pop
                ((array_stack<pstore::index::details::parent_type,_13UL> *)local_300);
    }
    if ((hash._7_1_ & 1) == 0) {
      *(long *)(this + 0x20) = *(long *)(this + 0x20) + 1;
    }
    hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::index::details::empty_class,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::iterator_base<false>::iterator_base
              (&local_440,(database_reference)parents.elements_,(parent_stack *)local_110,
               (hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::index::details::empty_class,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this);
    local_441 = (bool)(~hash._7_1_ & 1);
    std::
    make_pair<pstore::index::hamt_map<std::__cxx11::string,pstore::index::details::empty_class,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>>::iterator_base<false>,bool>
              (__return_storage_ptr__,&local_440,&local_441);
    hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::index::details::empty_class,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::iterator_base<false>::~iterator_base(&local_440);
  }
  return __return_storage_ptr__;
}

Assistant:

auto hamt_map<KeyType, ValueType, Hash, KeyEqual>::insert_or_upsert (
            transaction_base & transaction, OtherValueType const & value, bool is_upsert)
            -> std::pair<iterator, bool> {

            database & db = transaction.db ();
            if (revision_ != db.get_current_revision ()) {
                raise (error_code::index_not_latest_revision);
            }

            parent_stack parents;
            if (this->empty ()) {
                root_ = this->store_leaf_node (transaction, value, &parents);
                size_ = 1;
                return std::make_pair (iterator (db, std::move (parents), this), true);
            }

            parent_stack reverse_parents;
            bool key_exists = false;
            auto hash = static_cast<hash_type> (hash_ (value.first));
            std::tie (root_, key_exists) = this->insert_node (
                transaction, root_, value, hash, 0 /* shifts */, &reverse_parents, is_upsert);
            while (!reverse_parents.empty ()) {
                parents.push (reverse_parents.top ());
                reverse_parents.pop ();
            }
            if (!key_exists) {
                ++size_;
            }
            return std::make_pair (iterator (db, std::move (parents), this), !key_exists);
        }